

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserMetadata.cpp
# Opt level: O1

void __thiscall
slang::parsing::anon_unknown_4::MetadataVisitor::handle
          (MetadataVisitor *this,InterfacePortHeaderSyntax *syntax)

{
  int iVar1;
  InterfacePortHeaderSyntax *in_RAX;
  size_t sVar2;
  SyntaxNode *node;
  size_t sVar3;
  uint uVar4;
  string_view sVar5;
  Token token;
  InterfacePortHeaderSyntax *local_28;
  
  local_28 = in_RAX;
  sVar5 = Token::valueText(&syntax->nameOrKeyword);
  if (sVar5._M_len != 0) {
    if (sVar5._M_len == 9) {
      iVar1 = bcmp(sVar5._M_str,"interface",9);
      if (iVar1 == 0) goto LAB_003e1cff;
    }
    local_28 = syntax;
    std::
    vector<slang::syntax::InterfacePortHeaderSyntax_const*,std::allocator<slang::syntax::InterfacePortHeaderSyntax_const*>>
    ::emplace_back<slang::syntax::InterfacePortHeaderSyntax_const*>
              ((vector<slang::syntax::InterfacePortHeaderSyntax_const*,std::allocator<slang::syntax::InterfacePortHeaderSyntax_const*>>
                *)&(this->meta).interfacePorts,&local_28);
  }
LAB_003e1cff:
  sVar2 = slang::syntax::SyntaxNode::getChildCount((SyntaxNode *)syntax);
  if (sVar2 != 0) {
    uVar4 = 1;
    sVar2 = 0;
    do {
      node = slang::syntax::SyntaxNode::childNode((SyntaxNode *)syntax,sVar2);
      if (node == (SyntaxNode *)0x0) {
        token = slang::syntax::SyntaxNode::childToken((SyntaxNode *)syntax,sVar2);
        if (token.info != (Info *)0x0) {
          visitToken(this,token);
        }
      }
      else {
        slang::syntax::detail::
        visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::parsing::(anonymous_namespace)::MetadataVisitor>
                  (node,this);
      }
      sVar2 = (size_t)uVar4;
      sVar3 = slang::syntax::SyntaxNode::getChildCount((SyntaxNode *)syntax);
      uVar4 = uVar4 + 1;
    } while (sVar2 < sVar3);
  }
  return;
}

Assistant:

void handle(const InterfacePortHeaderSyntax& syntax) {
        std::string_view name = syntax.nameOrKeyword.valueText();
        if (name != "" && name != "interface")
            meta.interfacePorts.push_back(&syntax);
        visitDefault(syntax);
    }